

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

string * __thiscall
soul::convertToString_abi_cxx11_(string *__return_storage_ptr__,soul *this,Identifier *name)

{
  long *plVar1;
  
  plVar1 = *(long **)this;
  if (plVar1 != (long *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("isValid()","toString",0x23);
}

Assistant:

std::string repeatedCharacter (char c, size_t num)
{
    std::string s;
    s.resize (num, c);
    return s;
}